

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_alloc.c
# Opt level: O2

void mspace_free(mspace msp,void *mem)

{
  long *plVar1;
  size_t __len;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  byte bVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  ulong *puVar10;
  ulong *puVar11;
  long lVar12;
  ulong *puVar13;
  ulong *puVar14;
  long lVar15;
  ulong *puVar16;
  ulong *puVar17;
  ulong *puVar18;
  
  if (mem == (void *)0x0) {
    return;
  }
  puVar11 = *(ulong **)((long)msp + 0x18);
  puVar14 = (ulong *)((long)mem + -0x10);
  if ((puVar14 < puVar11) || (uVar9 = *(ulong *)((long)mem + -8), ((uint)uVar9 & 3) == 1))
  goto LAB_0015094e;
  uVar7 = uVar9 & 0xfffffffffffffff8;
  puVar13 = (ulong *)((long)puVar14 + uVar7);
  if ((uVar9 & 1) == 0) {
    uVar2 = *puVar14;
    if ((uVar9 & 2) == 0) {
      __len = uVar7 + 0x20 + uVar2;
      iVar6 = munmap((void *)((long)puVar14 - uVar2),__len);
      if (iVar6 != 0) {
        return;
      }
      *(long *)((long)msp + 0x358) = *(long *)((long)msp + 0x358) - __len;
      return;
    }
    puVar14 = (ulong *)((long)puVar14 - uVar2);
    if (puVar14 < puVar11) goto LAB_0015094e;
    uVar7 = uVar7 + uVar2;
    if (puVar14 == *(ulong **)((long)msp + 0x20)) {
      uVar9 = puVar13[1];
      if ((~(uint)uVar9 & 3) == 0) {
        *(ulong *)((long)msp + 8) = uVar7;
        puVar13[1] = uVar9 & 0xfffffffffffffffe;
        puVar14[1] = uVar7 | 1;
        *puVar13 = uVar7;
        return;
      }
    }
    else if (uVar2 < 0x100) {
      puVar16 = (ulong *)puVar14[2];
      puVar18 = (ulong *)puVar14[3];
      puVar10 = (ulong *)((long)msp + (uVar2 >> 3) * 0x10 + 0x48);
      if ((puVar16 != puVar10) && ((puVar16 < puVar11 || ((ulong *)puVar16[3] != puVar14))))
      goto LAB_0015094e;
      if (puVar18 == puVar16) {
        bVar5 = (byte)(uVar2 >> 3) & 0x1f;
        *(uint *)msp = *msp & (-2 << bVar5 | 0xfffffffeU >> 0x20 - bVar5);
      }
      else {
        if ((puVar18 != puVar10) && ((puVar18 < puVar11 || ((ulong *)puVar18[2] != puVar14))))
        goto LAB_0015094e;
        puVar16[3] = (ulong)puVar18;
        puVar18[2] = (ulong)puVar16;
      }
    }
    else {
      puVar10 = (ulong *)puVar14[3];
      uVar9 = puVar14[6];
      if (puVar10 == puVar14) {
        if ((ulong *)puVar14[5] == (ulong *)0x0) {
          if ((ulong *)puVar14[4] == (ulong *)0x0) {
            puVar10 = (ulong *)0x0;
            goto LAB_001504c2;
          }
          puVar16 = (ulong *)puVar14[4];
          puVar18 = puVar14 + 4;
        }
        else {
          puVar16 = (ulong *)puVar14[5];
          puVar18 = puVar14 + 5;
        }
        do {
          do {
            puVar17 = puVar18;
            puVar10 = puVar16;
            puVar16 = (ulong *)puVar10[5];
            puVar18 = puVar10 + 5;
          } while ((ulong *)puVar10[5] != (ulong *)0x0);
          puVar16 = (ulong *)puVar10[4];
          puVar18 = puVar10 + 4;
        } while ((ulong *)puVar10[4] != (ulong *)0x0);
        if (puVar17 < puVar11) goto LAB_0015094e;
        *puVar17 = 0;
      }
      else {
        puVar16 = (ulong *)puVar14[2];
        if (((puVar16 < puVar11) || ((ulong *)puVar16[3] != puVar14)) ||
           ((ulong *)puVar10[2] != puVar14)) goto LAB_0015094e;
        puVar16[3] = (ulong)puVar10;
        puVar10[2] = (ulong)puVar16;
      }
LAB_001504c2:
      if (uVar9 != 0) {
        uVar8 = (uint)puVar14[7];
        if (puVar14 == *(ulong **)((long)msp + (ulong)uVar8 * 8 + 600)) {
          *(ulong **)((long)msp + (ulong)uVar8 * 8 + 600) = puVar10;
          if (puVar10 == (ulong *)0x0) {
            bVar5 = (byte)uVar8 & 0x1f;
            *(uint *)((long)msp + 4) =
                 *(uint *)((long)msp + 4) & (-2 << bVar5 | 0xfffffffeU >> 0x20 - bVar5);
          }
          else {
LAB_00150504:
            puVar11 = *(ulong **)((long)msp + 0x18);
            if (puVar10 < puVar11) goto LAB_0015094e;
            puVar10[6] = uVar9;
            puVar16 = (ulong *)puVar14[4];
            if (puVar16 != (ulong *)0x0) {
              if (puVar16 < puVar11) goto LAB_0015094e;
              puVar10[4] = (ulong)puVar16;
              puVar16[6] = (ulong)puVar10;
            }
            uVar9 = puVar14[5];
            if (uVar9 != 0) {
              if (uVar9 < *(ulong *)((long)msp + 0x18)) goto LAB_0015094e;
              puVar10[5] = uVar9;
              *(ulong **)(uVar9 + 0x30) = puVar10;
            }
          }
        }
        else {
          if (uVar9 < *(ulong *)((long)msp + 0x18)) goto LAB_0015094e;
          *(ulong **)(uVar9 + 0x20 + (ulong)(*(ulong **)(uVar9 + 0x20) != puVar14) * 8) = puVar10;
          if (puVar10 != (ulong *)0x0) goto LAB_00150504;
        }
      }
    }
  }
  if ((puVar13 <= puVar14) || (uVar9 = puVar13[1], (uVar9 & 1) == 0)) goto LAB_0015094e;
  if ((uVar9 & 2) == 0) {
    if (puVar13 == *(ulong **)((long)msp + 0x28)) {
      uVar7 = uVar7 + *(long *)((long)msp + 0x10);
      *(ulong *)((long)msp + 0x10) = uVar7;
      *(ulong **)((long)msp + 0x28) = puVar14;
      puVar14[1] = uVar7 | 1;
      if (puVar14 == *(ulong **)((long)msp + 0x20)) {
        *(undefined8 *)((long)msp + 0x20) = 0;
        *(undefined8 *)((long)msp + 8) = 0;
      }
      if (uVar7 <= *(ulong *)((long)msp + 0x30)) {
        return;
      }
      sys_trim((mstate)msp,0);
      return;
    }
    if (puVar13 == *(ulong **)((long)msp + 0x20)) {
      uVar7 = uVar7 + *(long *)((long)msp + 8);
      *(ulong *)((long)msp + 8) = uVar7;
      *(ulong **)((long)msp + 0x20) = puVar14;
      puVar14[1] = uVar7 | 1;
      *(ulong *)((long)puVar14 + uVar7) = uVar7;
      return;
    }
    if (uVar9 < 0x100) {
      uVar3 = puVar13[2];
      uVar4 = puVar13[3];
      uVar2 = (long)msp + (uVar9 >> 3) * 0x10 + 0x48;
      if ((uVar3 != uVar2) &&
         ((uVar3 < *(ulong *)((long)msp + 0x18) || (*(ulong **)(uVar3 + 0x18) != puVar13))))
      goto LAB_0015094e;
      if (uVar4 == uVar3) {
        bVar5 = (byte)(uVar9 >> 3) & 0x1f;
        *(uint *)msp = *msp & (-2 << bVar5 | 0xfffffffeU >> 0x20 - bVar5);
      }
      else {
        if ((uVar4 != uVar2) &&
           ((uVar4 < *(ulong *)((long)msp + 0x18) || (*(ulong **)(uVar4 + 0x10) != puVar13))))
        goto LAB_0015094e;
        *(ulong *)(uVar3 + 0x18) = uVar4;
        *(ulong *)(uVar4 + 0x10) = uVar3;
      }
    }
    else {
      puVar11 = (ulong *)puVar13[3];
      uVar2 = puVar13[6];
      if (puVar11 == puVar13) {
        if ((ulong *)puVar13[5] == (ulong *)0x0) {
          if ((ulong *)puVar13[4] == (ulong *)0x0) {
            puVar11 = (ulong *)0x0;
            goto LAB_00150893;
          }
          puVar10 = (ulong *)puVar13[4];
          puVar16 = puVar13 + 4;
        }
        else {
          puVar10 = (ulong *)puVar13[5];
          puVar16 = puVar13 + 5;
        }
        do {
          do {
            puVar18 = puVar16;
            puVar11 = puVar10;
            puVar10 = (ulong *)puVar11[5];
            puVar16 = puVar11 + 5;
          } while ((ulong *)puVar11[5] != (ulong *)0x0);
          puVar10 = (ulong *)puVar11[4];
          puVar16 = puVar11 + 4;
        } while ((ulong *)puVar11[4] != (ulong *)0x0);
        if (puVar18 < *(ulong **)((long)msp + 0x18)) goto LAB_0015094e;
        *puVar18 = 0;
      }
      else {
        uVar3 = puVar13[2];
        if (((uVar3 < *(ulong *)((long)msp + 0x18)) || (*(ulong **)(uVar3 + 0x18) != puVar13)) ||
           ((ulong *)puVar11[2] != puVar13)) goto LAB_0015094e;
        *(ulong **)(uVar3 + 0x18) = puVar11;
        puVar11[2] = uVar3;
      }
LAB_00150893:
      if (uVar2 != 0) {
        uVar8 = (uint)puVar13[7];
        if (puVar13 == *(ulong **)((long)msp + (ulong)uVar8 * 8 + 600)) {
          *(ulong **)((long)msp + (ulong)uVar8 * 8 + 600) = puVar11;
          if (puVar11 == (ulong *)0x0) {
            bVar5 = (byte)uVar8 & 0x1f;
            *(uint *)((long)msp + 4) =
                 *(uint *)((long)msp + 4) & (-2 << bVar5 | 0xfffffffeU >> 0x20 - bVar5);
          }
          else {
LAB_001508d1:
            puVar10 = *(ulong **)((long)msp + 0x18);
            if (puVar11 < puVar10) goto LAB_0015094e;
            puVar11[6] = uVar2;
            puVar16 = (ulong *)puVar13[4];
            if (puVar16 != (ulong *)0x0) {
              if (puVar16 < puVar10) goto LAB_0015094e;
              puVar11[4] = (ulong)puVar16;
              puVar16[6] = (ulong)puVar11;
            }
            uVar2 = puVar13[5];
            if (uVar2 != 0) {
              if (uVar2 < *(ulong *)((long)msp + 0x18)) goto LAB_0015094e;
              puVar11[5] = uVar2;
              *(ulong **)(uVar2 + 0x30) = puVar11;
            }
          }
        }
        else {
          if (uVar2 < *(ulong *)((long)msp + 0x18)) goto LAB_0015094e;
          *(ulong **)(uVar2 + 0x20 + (ulong)(*(ulong **)(uVar2 + 0x20) != puVar13) * 8) = puVar11;
          if (puVar11 != (ulong *)0x0) goto LAB_001508d1;
        }
      }
    }
    uVar7 = uVar7 + (uVar9 & 0xfffffffffffffff8);
    puVar14[1] = uVar7 | 1;
    *(ulong *)((long)puVar14 + uVar7) = uVar7;
    if (puVar14 == *(ulong **)((long)msp + 0x20)) {
      *(ulong *)((long)msp + 8) = uVar7;
      return;
    }
  }
  else {
    puVar13[1] = uVar9 & 0xfffffffffffffffe;
    puVar14[1] = uVar7 | 1;
    *(ulong *)((long)puVar14 + uVar7) = uVar7;
  }
  if (uVar7 < 0x100) {
    uVar9 = (long)msp + (uVar7 >> 3) * 0x10 + 0x48;
    uVar8 = (uint)(uVar7 >> 3);
    if ((*msp >> (uVar8 & 0x1f) & 1) == 0) {
      *(uint *)msp = *msp | 1 << (uVar8 & 0x1f);
      uVar7 = uVar9;
    }
    else {
      uVar7 = *(ulong *)(uVar9 + 0x10);
      if (*(ulong *)(uVar9 + 0x10) < *(ulong *)((long)msp + 0x18)) {
LAB_0015094e:
        abort();
      }
    }
    *(ulong **)(uVar9 + 0x10) = puVar14;
    *(ulong **)(uVar7 + 0x18) = puVar14;
    puVar14[2] = uVar7;
    puVar14[3] = uVar9;
  }
  else {
    uVar8 = (uint)(uVar7 >> 8);
    if (uVar8 == 0) {
      uVar8 = 0;
    }
    else if (uVar8 < 0x10000) {
      uVar8 = ((uint)(uVar7 >> ((ulong)(byte)(0x26 - (char)LZCOUNT(uVar8)) & 0x3f)) & 1) +
              LZCOUNT(uVar8) * 2 ^ 0x3e;
    }
    else {
      uVar8 = 0x1f;
    }
    *(uint *)(puVar14 + 7) = uVar8;
    puVar11 = (ulong *)((long)msp + (ulong)uVar8 * 8 + 600);
    puVar14[4] = 0;
    puVar14[5] = 0;
    if ((*(uint *)((long)msp + 4) >> (uVar8 & 0x1f) & 1) == 0) {
      *(uint *)((long)msp + 4) = *(uint *)((long)msp + 4) | 1 << (uVar8 & 0x1f);
      puVar13 = puVar11;
    }
    else {
      uVar9 = (ulong)(byte)(0x39 - (char)(uVar8 >> 1));
      if (uVar8 == 0x1f) {
        uVar9 = 0;
      }
      lVar12 = uVar7 << (uVar9 & 0x3f);
      puVar11 = (ulong *)*puVar11;
      do {
        puVar10 = puVar11;
        if ((puVar10[1] & 0xfffffffffffffff8) == uVar7) {
          if ((puVar10 < *(ulong **)((long)msp + 0x18)) ||
             (puVar13 = (ulong *)puVar10[2], puVar13 < *(ulong **)((long)msp + 0x18)))
          goto LAB_0015094e;
          puVar11 = puVar10 + 2;
          puVar13[3] = (ulong)puVar14;
          lVar12 = 0x30;
          lVar15 = 0x10;
          puVar16 = (ulong *)0x0;
          goto LAB_00150814;
        }
        lVar15 = lVar12 >> 0x3f;
        lVar12 = lVar12 * 2;
        puVar11 = (ulong *)puVar10[4 - lVar15];
      } while ((ulong *)puVar10[4 - lVar15] != (ulong *)0x0);
      puVar11 = puVar10 + (4 - lVar15);
      puVar13 = puVar10;
      if (puVar11 < *(ulong **)((long)msp + 0x18)) goto LAB_0015094e;
    }
    lVar15 = 0x30;
    lVar12 = 0x10;
    puVar10 = puVar14;
    puVar16 = puVar14;
LAB_00150814:
    *puVar11 = (ulong)puVar14;
    *(ulong **)((long)puVar14 + lVar15) = puVar13;
    puVar14[3] = (ulong)puVar10;
    *(ulong **)((long)puVar14 + lVar12) = puVar16;
    plVar1 = (long *)((long)msp + 0x38);
    *plVar1 = *plVar1 + -1;
    if (*plVar1 == 0) {
      release_unused_segments((mstate)msp);
      return;
    }
  }
  return;
}

Assistant:

void mspace_free(mspace msp, void* mem) {
  if (mem != 0) {
    mchunkptr p  = mem2chunk(mem);
#if FOOTERS
    mstate fm = get_mstate_for(p);
    (void)msp; /* placate people compiling -Wunused */
#else /* FOOTERS */
    mstate fm = (mstate)msp;
#endif /* FOOTERS */
    if (!ok_magic(fm)) {
      USAGE_ERROR_ACTION(fm, p);
      return;
    }
    if (!PREACTION(fm)) {
      check_inuse_chunk(fm, p);
      if (RTCHECK(ok_address(fm, p) && ok_inuse(p))) {
        size_t psize = chunksize(p);
        mchunkptr next = chunk_plus_offset(p, psize);
        if (!pinuse(p)) {
          size_t prevsize = p->prev_foot;
          if (is_mmapped(p)) {
            psize += prevsize + MMAP_FOOT_PAD;
            if (CALL_MUNMAP((char*)p - prevsize, psize) == 0)
              fm->footprint -= psize;
            goto postaction;
          }
          else {
            mchunkptr prev = chunk_minus_offset(p, prevsize);
            psize += prevsize;
            p = prev;
            if (RTCHECK(ok_address(fm, prev))) { /* consolidate backward */
              if (p != fm->dv) {
                unlink_chunk(fm, p, prevsize);
              }
              else if ((next->head & INUSE_BITS) == INUSE_BITS) {
                fm->dvsize = psize;
                set_free_with_pinuse(p, psize, next);
                goto postaction;
              }
            }
            else
              goto erroraction;
          }
        }

        if (RTCHECK(ok_next(p, next) && ok_pinuse(next))) {
          if (!cinuse(next)) {  /* consolidate forward */
            if (next == fm->top) {
              size_t tsize = fm->topsize += psize;
              fm->top = p;
              p->head = tsize | PINUSE_BIT;
              if (p == fm->dv) {
                fm->dv = 0;
                fm->dvsize = 0;
              }
              if (should_trim(fm, tsize))
                sys_trim(fm, 0);
              goto postaction;
            }
            else if (next == fm->dv) {
              size_t dsize = fm->dvsize += psize;
              fm->dv = p;
              set_size_and_pinuse_of_free_chunk(p, dsize);
              goto postaction;
            }
            else {
              size_t nsize = chunksize(next);
              psize += nsize;
              unlink_chunk(fm, next, nsize);
              set_size_and_pinuse_of_free_chunk(p, psize);
              if (p == fm->dv) {
                fm->dvsize = psize;
                goto postaction;
              }
            }
          }
          else
            set_free_with_pinuse(p, psize, next);

          if (is_small(psize)) {
            insert_small_chunk(fm, p, psize);
            check_free_chunk(fm, p);
          }
          else {
            tchunkptr tp = (tchunkptr)p;
            insert_large_chunk(fm, tp, psize);
            check_free_chunk(fm, p);
            if (--fm->release_checks == 0)
              release_unused_segments(fm);
          }
          goto postaction;
        }
      }
    erroraction:
      USAGE_ERROR_ACTION(fm, p);
    postaction:
      POSTACTION(fm);
    }
  }
}